

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_globaltype_t * wasm_globaltype_new(wasm_valtype_t *type,wasm_mutability_t mut)

{
  wasm_globaltype_t *this;
  GlobalType local_38;
  wasm_globaltype_t *local_20;
  wasm_globaltype_t *result;
  wasm_valtype_t *pwStack_10;
  wasm_mutability_t mut_local;
  wasm_valtype_t *type_local;
  
  result._7_1_ = mut;
  pwStack_10 = type;
  if (type != (wasm_valtype_t *)0x0) {
    this = (wasm_globaltype_t *)operator_new(0x18);
    wabt::interp::GlobalType::GlobalType
              (&local_38,(ValueType)(pwStack_10->I).enum_,(uint)(result._7_1_ != '\0'));
    wasm_globaltype_t::wasm_globaltype_t(this,&local_38);
    wabt::interp::GlobalType::~GlobalType(&local_38);
    local_20 = this;
    wasm_valtype_delete(pwStack_10);
    return local_20;
  }
  __assert_fail("type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,0x335,"wasm_globaltype_t *wasm_globaltype_new(wasm_valtype_t *, wasm_mutability_t)"
               );
}

Assistant:

own wasm_globaltype_t* wasm_globaltype_new(own wasm_valtype_t* type,
                                           wasm_mutability_t mut) {
  assert(type);
  auto* result = new wasm_globaltype_t{GlobalType{
      type->I, mut == WASM_CONST ? Mutability::Const : Mutability::Var}};
  wasm_valtype_delete(type);
  return result;
}